

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long v1;
  Nonnull<const_char_*> pcVar4;
  long v2;
  undefined4 extraout_var_00;
  
  do {
    iVar1 = this->stream_count_;
    if (iVar1 < 1) break;
    iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
    iVar3 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[4])(*this->streams_,(ulong)(uint)count);
    if ((char)iVar3 == '\0') {
      v2 = CONCAT44(extraout_var,iVar2) + (long)count;
      iVar2 = (*(*this->streams_)->_vptr_ZeroCopyInputStream[5])();
      v1 = CONCAT44(extraout_var_00,iVar2);
      if (v1 < v2) {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,v2,"final_byte_count < target_byte_count");
      }
      if (pcVar4 != (Nonnull<const_char_*>)0x0) {
        Skip();
      }
      this->bytes_retired_ = this->bytes_retired_ + v1;
      count = (int)v2 - iVar2;
      this->streams_ = this->streams_ + 1;
      this->stream_count_ = this->stream_count_ + -1;
    }
  } while ((char)iVar3 == '\0');
  return 0 < iVar1;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64_t target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64_t final_byte_count = streams_[0]->ByteCount();
    ABSL_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}